

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

size_t Assimp::IFC::CloseWindows
                 (ContourVector *contours,IfcMatrix4 *minv,OpeningRefVector *contours_to_openings,
                 TempMesh *curmesh)

{
  pointer *ppaVar1;
  pointer *ppuVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  pointer paVar10;
  long *plVar11;
  uint *puVar12;
  pointer ppTVar13;
  iterator iVar14;
  ulong uVar15;
  long *plVar16;
  TempMesh *pTVar17;
  bool bVar18;
  ulong uVar19;
  long *plVar20;
  long lVar21;
  pointer ppTVar22;
  aiVector3t<double> *paVar23;
  long *plVar24;
  const_iterator cit;
  pointer paVar25;
  uint uVar26;
  long lVar27;
  pointer paVar28;
  pointer paVar29;
  int iVar30;
  IfcVector2 *proj_point_1;
  iterator current;
  bool bVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  IfcVector3 start0;
  IfcVector3 contourNormal;
  IfcVector3 start1;
  IfcVector3 world_point;
  OpeningRefs *__range5;
  ulong *local_128;
  IfcVector3 local_118;
  size_t local_100;
  IfcVector3 local_f8;
  aiVector3t<double> local_d8;
  uint local_bc;
  aiVector3t<double> local_b8;
  TempMesh *local_98;
  aiVector3t<double> *local_90;
  aiVector3t<double> *local_88;
  ContourVector *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  aiVector3t<double> *local_70;
  aiVector3t<double> *local_68;
  pointer local_60;
  OpeningRefVector *local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  ProjectedWindowContour *local_38;
  
  current._M_current =
       (contours->
       super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_50 = (contours->
             super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (current._M_current == local_50) {
    local_100 = 0;
  }
  else {
    local_78 = &curmesh->mVertcnt;
    local_100 = 0;
    local_98 = curmesh;
    local_80 = contours;
    local_58 = contours_to_openings;
    do {
      paVar28 = ((current._M_current)->contour).
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start;
      paVar10 = ((current._M_current)->contour).
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish;
      if (paVar28 != paVar10) {
        uVar19 = (ulong)((long)current._M_current -
                        (long)(local_80->
                              super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 3;
        local_60 = (local_58->
                   super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        plVar24 = *(long **)((long)local_60 + uVar19 * 0x6276276276276278);
        plVar11 = *(long **)((long)local_60 + (uVar19 * 0xc4ec4ec4ec4ec4f + 1) * 8);
        pTVar17 = local_98;
        if (plVar24 != plVar11) {
          local_60 = (pointer)((long)local_60 + uVar19 * 0x6276276276276278);
          plVar16 = plVar24;
          do {
            plVar20 = plVar16 + 1;
            bVar18 = false;
            if (*(long *)(*plVar16 + 0x40) != *(long *)(*plVar16 + 0x48)) {
              bVar18 = true;
              break;
            }
            plVar16 = plVar20;
          } while (plVar20 != plVar11);
          pTVar17 = local_98;
          if (bVar18) {
            std::vector<bool,_std::allocator<bool>_>::resize
                      (&(current._M_current)->skiplist,(long)paVar10 - (long)paVar28 >> 4,false);
            FindAdjacentContours(current,local_80);
            FindBorderContours(current);
            if ((current._M_current)->is_rectangular == true) {
              FindLikelyCrossingLines(current);
            }
            local_128 = ((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>.
                        _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            lVar27 = (long)((current._M_current)->contour).
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)((current._M_current)->contour).
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>.
                       _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                + ((long)((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>
                         ._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (long)local_128) * 8 != lVar27 >> 4) {
              __assert_fail("(*it).skiplist.size() == (*it).contour.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCOpenings.cpp"
                            ,0x386,
                            "size_t Assimp::IFC::CloseWindows(ContourVector &, const IfcMatrix4 &, OpeningRefVector &, TempMesh &)"
                           );
            }
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                      (&curmesh->mVerts,
                       (lVar27 >> 2) +
                       ((long)(curmesh->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(curmesh->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
            ;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                      (local_78,((long)((current._M_current)->contour).
                                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)((current._M_current)->contour).
                                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) +
                                ((long)(curmesh->mVertcnt).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(curmesh->mVertcnt).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2));
            puVar12 = (curmesh->mVertcnt).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish == puVar12) {
              bVar18 = false;
            }
            else {
              TempMesh::ComputePolygonNormal
                        (&local_118,
                         (curmesh->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,(ulong)*puVar12,true);
              std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                        ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                         &local_d8,
                         (long)((current._M_current)->contour).
                               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)((current._M_current)->contour).
                               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4,
                         (allocator_type *)&local_f8);
              paVar28 = ((current._M_current)->contour).
                        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((current._M_current)->contour).
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish != paVar28) {
                lVar27 = 8;
                lVar21 = 0x10;
                uVar19 = 0;
                do {
                  dVar3 = *(double *)((long)paVar28 + lVar27 + -8);
                  dVar32 = *(double *)((long)&paVar28->x + lVar27);
                  dVar33 = minv->b2;
                  dVar34 = minv->b1;
                  dVar4 = minv->b3;
                  dVar5 = minv->b4;
                  dVar6 = minv->c2;
                  dVar7 = minv->c1;
                  dVar8 = minv->c3;
                  dVar9 = minv->c4;
                  *(double *)((long)local_d8.x + lVar21 + -0x10) =
                       minv->a3 * 0.0 + minv->a1 * dVar3 + minv->a2 * dVar32 + minv->a4;
                  *(double *)((long)local_d8.x + lVar21 + -8) =
                       dVar4 * 0.0 + dVar34 * dVar3 + dVar33 * dVar32 + dVar5;
                  *(double *)((long)(double *)local_d8.x + lVar21) =
                       dVar8 * 0.0 + dVar3 * dVar7 + dVar32 * dVar6 + dVar9;
                  uVar19 = uVar19 + 1;
                  paVar28 = ((current._M_current)->contour).
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar27 = lVar27 + 0x10;
                  lVar21 = lVar21 + 0x18;
                } while (uVar19 < (ulong)((long)((current._M_current)->contour).
                                                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)paVar28 >> 4));
              }
              TempMesh::ComputePolygonNormal
                        (&local_f8,(IfcVector3 *)local_d8.x,
                         ((long)local_d8.y - (long)local_d8.x >> 3) * -0x5555555555555555,true);
              bVar18 = 0.0 < local_f8.z * local_118.z +
                             local_f8.x * local_118.x + local_f8.y * local_118.y;
              if ((IfcVector3 *)local_d8.x != (IfcVector3 *)0x0) {
                operator_delete((void *)local_d8.x,(long)local_d8.z - (long)local_d8.x);
              }
            }
            local_118.x = 0.0;
            local_118.y = 0.0;
            local_118.z = 0.0;
            local_d8.z = 0.0;
            local_d8.x = 0.0;
            local_d8.y = 0.0;
            paVar28 = ((current._M_current)->contour).
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            paVar10 = ((current._M_current)->contour).
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (paVar28 != paVar10) {
              local_70 = &local_f8;
              local_68 = &local_b8;
              if (bVar18) {
                local_70 = &local_b8;
                local_68 = &local_f8;
              }
              local_90 = &local_118;
              local_88 = &local_d8;
              if (bVar18) {
                local_90 = &local_d8;
                local_88 = &local_118;
              }
              local_48 = paVar10 + -1;
              bVar31 = false;
              uVar19 = 0;
              paVar25 = paVar28;
              local_40 = paVar10;
              do {
                local_f8.x = 0.0;
                local_f8.y = 0.0;
                local_f8.z = 0.0;
                dVar3 = paVar25->x;
                dVar32 = paVar25->y;
                local_b8.x = minv->a3 * 0.0 + minv->a1 * dVar3 + minv->a2 * dVar32 + minv->a4;
                local_b8.y = minv->b3 * 0.0 + minv->b1 * dVar3 + minv->b2 * dVar32 + minv->b4;
                local_b8.z = minv->c3 * 0.0 + dVar3 * minv->c1 + dVar32 * minv->c2 + minv->c4;
                ppTVar22 = (local_60->
                           super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                ppTVar13 = *(pointer *)
                            ((long)&(local_60->
                                    super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                                    )._M_impl.super__Vector_impl_data + 8);
                if (ppTVar22 != ppTVar13) {
                  dVar3 = 10000000000.0;
                  do {
                    for (paVar29 = ((*ppTVar22)->wallPoints).
                                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        paVar29 !=
                        *(pointer *)
                         ((long)&((*ppTVar22)->wallPoints).
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl + 8); paVar29 = paVar29 + 1) {
                      dVar33 = local_b8.x - paVar29->x;
                      dVar34 = local_b8.y - paVar29->y;
                      dVar32 = local_b8.z - paVar29->z;
                      dVar32 = dVar32 * dVar32 + dVar33 * dVar33 + dVar34 * dVar34;
                      if ((dVar32 < dVar3) && (1e-05 <= dVar32)) {
                        local_f8.z = paVar29->z;
                        local_f8.x = (double)paVar29->x;
                        local_f8.y = paVar29->y;
                        dVar3 = dVar32;
                      }
                    }
                    ppTVar22 = ppTVar22 + 1;
                  } while (ppTVar22 != ppTVar13);
                }
                if (bVar31) {
                  ppaVar1 = &(curmesh->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + -2;
                }
                else {
                  bVar31 = (bool)(paVar25 == paVar28 ^ bVar18);
                  paVar23 = &local_f8;
                  if (bVar31) {
                    paVar23 = &local_b8;
                  }
                  iVar14._M_current =
                       (curmesh->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar14._M_current ==
                      (curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                    _M_realloc_insert<aiVector3t<double>const&>
                              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                               curmesh,iVar14,paVar23);
                  }
                  else {
                    (iVar14._M_current)->z = paVar23->z;
                    dVar3 = paVar23->y;
                    (iVar14._M_current)->x = paVar23->x;
                    (iVar14._M_current)->y = dVar3;
                    ppaVar1 = &(curmesh->mVerts).
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar1 = *ppaVar1 + 1;
                  }
                  paVar23 = &local_b8;
                  if (bVar31) {
                    paVar23 = &local_f8;
                  }
                  iVar14._M_current =
                       (curmesh->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar14._M_current ==
                      (curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                    _M_realloc_insert<aiVector3t<double>const&>
                              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                               curmesh,iVar14,paVar23);
                  }
                  else {
                    (iVar14._M_current)->z = paVar23->z;
                    dVar3 = paVar23->y;
                    (iVar14._M_current)->x = paVar23->x;
                    (iVar14._M_current)->y = dVar3;
                    ppaVar1 = &(curmesh->mVerts).
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar1 = *ppaVar1 + 1;
                  }
                  local_bc = 4;
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_int>(local_78,&local_bc);
                  local_100 = local_100 + 1;
                }
                if (paVar25 == paVar28) {
                  local_118.z = local_b8.z;
                  local_118.x = local_b8.x;
                  local_118.y = local_b8.y;
                  local_d8.x = local_f8.x;
                  local_d8.y = local_f8.y;
                  local_d8.z = local_f8.z;
                }
                else {
                  iVar14._M_current =
                       (curmesh->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar14._M_current ==
                      (curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                    _M_realloc_insert<aiVector3t<double>const&>
                              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                               curmesh,iVar14,local_68);
                  }
                  else {
                    (iVar14._M_current)->z = local_68->z;
                    dVar3 = local_68->y;
                    (iVar14._M_current)->x = local_68->x;
                    (iVar14._M_current)->y = dVar3;
                    ppaVar1 = &(curmesh->mVerts).
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar1 = *ppaVar1 + 1;
                  }
                  iVar14._M_current =
                       (curmesh->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar14._M_current ==
                      (curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                    _M_realloc_insert<aiVector3t<double>const&>
                              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                               curmesh,iVar14,local_70);
                  }
                  else {
                    (iVar14._M_current)->z = local_70->z;
                    dVar3 = local_70->y;
                    (iVar14._M_current)->x = local_70->x;
                    (iVar14._M_current)->y = dVar3;
                    ppaVar1 = &(curmesh->mVerts).
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar1 = *ppaVar1 + 1;
                  }
                  if (paVar25 == local_48) {
                    if ((*local_128 >> (uVar19 & 0x3f) & 1) == 0) {
                      iVar14._M_current =
                           (curmesh->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if (iVar14._M_current ==
                          (curmesh->mVerts).
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                        _M_realloc_insert<aiVector3t<double>const&>
                                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                                   curmesh,iVar14,local_88);
                      }
                      else {
                        (iVar14._M_current)->z = local_88->z;
                        dVar3 = local_88->y;
                        (iVar14._M_current)->x = local_88->x;
                        (iVar14._M_current)->y = dVar3;
                        ppaVar1 = &(curmesh->mVerts).
                                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppaVar1 = *ppaVar1 + 1;
                      }
                      iVar14._M_current =
                           (curmesh->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if (iVar14._M_current ==
                          (curmesh->mVerts).
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                        _M_realloc_insert<aiVector3t<double>const&>
                                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                                   curmesh,iVar14,local_90);
                      }
                      else {
                        (iVar14._M_current)->z = local_90->z;
                        dVar3 = local_90->y;
                        (iVar14._M_current)->x = local_90->x;
                        (iVar14._M_current)->y = dVar3;
                        ppaVar1 = &(curmesh->mVerts).
                                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppaVar1 = *ppaVar1 + 1;
                      }
                    }
                    else {
                      ppuVar2 = &(curmesh->mVertcnt).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                      *ppuVar2 = *ppuVar2 + -1;
                      local_100 = local_100 - 1;
                      ppaVar1 = &(curmesh->mVerts).
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppaVar1 = *ppaVar1 + -2;
                    }
                  }
                }
                paVar25 = paVar25 + 1;
                iVar30 = (int)uVar19;
                uVar15 = *local_128;
                local_128 = local_128 + (iVar30 == 0x3f);
                uVar26 = iVar30 + 1;
                if (iVar30 == 0x3f) {
                  uVar26 = 0;
                }
                bVar31 = (uVar15 >> (uVar19 & 0x3f) & 1) != 0;
                uVar19 = (ulong)uVar26;
              } while (paVar25 != local_40);
            }
            goto LAB_005dc19c;
          }
        }
        for (; curmesh = pTVar17, local_98 = curmesh, local_38 = current._M_current,
            plVar24 != plVar11; plVar24 = plVar24 + 1) {
          lVar27 = *plVar24;
          if (*(long *)(lVar27 + 0x40) != *(long *)(lVar27 + 0x48)) {
            __assert_fail("opening->wallPoints.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCOpenings.cpp"
                          ,0x3ec,
                          "size_t Assimp::IFC::CloseWindows(ContourVector &, const IfcMatrix4 &, OpeningRefVector &, TempMesh &)"
                         );
          }
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                     (lVar27 + 0x40),
                     ((long)((current._M_current)->contour).
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)((current._M_current)->contour).
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) +
                     (*(long *)(lVar27 + 0x50) - *(long *)(lVar27 + 0x40) >> 3) *
                     -0x5555555555555555);
          for (paVar25 = paVar28; paVar25 != paVar10; paVar25 = paVar25 + 1) {
            dVar3 = paVar25->x;
            dVar32 = paVar25->y;
            local_118.x = minv->a3 * 0.0 + minv->a1 * dVar3 + minv->a2 * dVar32 + minv->a4;
            local_118.y = minv->b3 * 0.0 + minv->b1 * dVar3 + minv->b2 * dVar32 + minv->b4;
            local_118.z = minv->c3 * 0.0 + dVar3 * minv->c1 + dVar32 * minv->c2 + minv->c4;
            iVar14._M_current = *(aiVector3t<double> **)(lVar27 + 0x48);
            if (iVar14._M_current == *(aiVector3t<double> **)(lVar27 + 0x50)) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                         (lVar27 + 0x40),iVar14,&local_118);
            }
            else {
              (iVar14._M_current)->z = local_118.z;
              (iVar14._M_current)->x = local_118.x;
              (iVar14._M_current)->y = local_118.y;
              *(long *)(lVar27 + 0x48) = *(long *)(lVar27 + 0x48) + 0x18;
            }
          }
          current._M_current = local_38;
          pTVar17 = local_98;
        }
      }
LAB_005dc19c:
      current._M_current = current._M_current + 1;
    } while (current._M_current != local_50);
  }
  return local_100;
}

Assistant:

size_t CloseWindows(ContourVector& contours,
    const IfcMatrix4& minv,
    OpeningRefVector& contours_to_openings,
    TempMesh& curmesh)
{
    size_t closed = 0;
    // For all contour points, check if one of the assigned openings does
    // already have points assigned to it. In this case, assume this is
    // the other side of the wall and generate connections between
    // the two holes in order to close the window.

    // All this gets complicated by the fact that contours may pertain to
    // multiple openings(due to merging of adjacent or overlapping openings).
    // The code is based on the assumption that this happens symmetrically
    // on both sides of the wall. If it doesn't (which would be a bug anyway)
    // wrong geometry may be generated.
    for (ContourVector::iterator it = contours.begin(), end = contours.end(); it != end; ++it) {
        if ((*it).IsInvalid()) {
            continue;
        }
        OpeningRefs& refs = contours_to_openings[std::distance(contours.begin(), it)];

        bool has_other_side = false;
        for(const TempOpening* opening : refs) {
            if(!opening->wallPoints.empty()) {
                has_other_side = true;
                break;
            }
        }

        if (has_other_side) {

            ContourRefVector adjacent_contours;

            // prepare a skiplist for this contour. The skiplist is used to
            // eliminate unwanted contour lines for adjacent windows and
            // those bordering the outer frame.
            (*it).PrepareSkiplist();

            FindAdjacentContours(it, contours);
            FindBorderContours(it);

            // if the window is the result of a finite union or intersection of rectangles,
            // there shouldn't be any crossing or diagonal lines in it. Such lines would
            // be artifacts caused by numerical inaccuracies or other bugs in polyclipper
            // and our own code. Since rectangular openings are by far the most frequent
            // case, it is worth filtering for this corner case.
            if((*it).is_rectangular) {
                FindLikelyCrossingLines(it);
            }

            ai_assert((*it).skiplist.size() == (*it).contour.size());

            SkipList::const_iterator skipbegin = (*it).skiplist.begin();

            curmesh.mVerts.reserve(curmesh.mVerts.size() + (*it).contour.size() * 4);
            curmesh.mVertcnt.reserve(curmesh.mVertcnt.size() + (*it).contour.size());

			bool reverseCountourFaces = false;

            // compare base poly normal and contour normal to detect if we need to reverse the face winding
			if(curmesh.mVertcnt.size() > 0) {
				IfcVector3 basePolyNormal = TempMesh::ComputePolygonNormal(curmesh.mVerts.data(), curmesh.mVertcnt.front());
				
				std::vector<IfcVector3> worldSpaceContourVtx(it->contour.size());
				
				for(size_t a = 0; a < it->contour.size(); ++a)
					worldSpaceContourVtx[a] = minv * IfcVector3(it->contour[a].x, it->contour[a].y, 0.0);
				
				IfcVector3 contourNormal = TempMesh::ComputePolygonNormal(worldSpaceContourVtx.data(), worldSpaceContourVtx.size());
				
				reverseCountourFaces = (contourNormal * basePolyNormal) > 0.0;
			}

            // XXX this algorithm is really a bit inefficient - both in terms
            // of constant factor and of asymptotic runtime.
            std::vector<bool>::const_iterator skipit = skipbegin;

            IfcVector3 start0;
            IfcVector3 start1;

            const Contour::const_iterator cbegin = (*it).contour.begin(), cend = (*it).contour.end();

            bool drop_this_edge = false;
            for (Contour::const_iterator cit = cbegin; cit != cend; ++cit, drop_this_edge = *skipit++) {
                const IfcVector2& proj_point = *cit;

                // Locate the closest opposite point. This should be a good heuristic to
                // connect only the points that are really intended to be connected.
                IfcFloat best = static_cast<IfcFloat>(1e10);
                IfcVector3 bestv;

                const IfcVector3 world_point = minv * IfcVector3(proj_point.x,proj_point.y,0.0f);

                for(const TempOpening* opening : refs) {
                    for(const IfcVector3& other : opening->wallPoints) {
                        const IfcFloat sqdist = (world_point - other).SquareLength();

                        if (sqdist < best) {
                            // avoid self-connections
                            if(sqdist < 1e-5) {
                                continue;
                            }

                            bestv = other;
                            best = sqdist;
                        }
                    }
                }

                if (drop_this_edge) {
                    curmesh.mVerts.pop_back();
                    curmesh.mVerts.pop_back();
                }
                else {
                    curmesh.mVerts.push_back(((cit == cbegin) != reverseCountourFaces) ? world_point : bestv);
                    curmesh.mVerts.push_back(((cit == cbegin) != reverseCountourFaces) ? bestv : world_point);

                    curmesh.mVertcnt.push_back(4);
                    ++closed;
                }

                if (cit == cbegin) {
                    start0 = world_point;
                    start1 = bestv;
                    continue;
                }

                curmesh.mVerts.push_back(reverseCountourFaces ? bestv : world_point);
                curmesh.mVerts.push_back(reverseCountourFaces ? world_point : bestv);

                if (cit == cend - 1) {
                    drop_this_edge = *skipit;

                    // Check if the final connection (last to first element) is itself
                    // a border edge that needs to be dropped.
                    if (drop_this_edge) {
                        --closed;
                        curmesh.mVertcnt.pop_back();
                        curmesh.mVerts.pop_back();
                        curmesh.mVerts.pop_back();
                    }
                    else {
                        curmesh.mVerts.push_back(reverseCountourFaces ? start0 : start1);
                        curmesh.mVerts.push_back(reverseCountourFaces ? start1 : start0);
                    }
                }
            }
        }
        else {

            const Contour::const_iterator cbegin = (*it).contour.begin(), cend = (*it).contour.end();
            for(TempOpening* opening : refs) {
                ai_assert(opening->wallPoints.empty());
                opening->wallPoints.reserve(opening->wallPoints.capacity() + (*it).contour.size());
                for (Contour::const_iterator cit = cbegin; cit != cend; ++cit) {

                    const IfcVector2& proj_point = *cit;
                    opening->wallPoints.push_back(minv * IfcVector3(proj_point.x,proj_point.y,0.0f));
                }
            }
        }
    }
    return closed;
}